

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsizegrip.cpp
# Opt level: O0

int __thiscall QSizeGripPrivate::init(QSizeGripPrivate *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  Corner CVar2;
  QWidget *pQVar3;
  long in_FS_OFFSET;
  QSizeGrip *q;
  QSizeGripPrivate *this_00;
  QWidget *this_01;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 policy;
  bool local_29;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = &q_func(this)->super_QWidget;
  bVar1 = QWidget::isLeftToRight((QWidget *)0x680029);
  CVar2 = BottomLeftCorner;
  if (bVar1) {
    CVar2 = BottomRightCorner;
  }
  this->m_corner = CVar2;
  local_29 = true;
  if (this->m_corner != TopLeftCorner) {
    local_29 = this->m_corner == BottomRightCorner;
  }
  this_00 = (QSizeGripPrivate *)&stack0xfffffffffffffff0;
  this_01 = pQVar3;
  QCursor::QCursor((QCursor *)this_00,local_29 + SizeBDiagCursor);
  QWidget::setCursor(this_01,(QCursor *)this);
  policy.data = (quint32)((ulong)this_01 >> 0x20);
  QCursor::~QCursor((QCursor *)this_00);
  QSizePolicy::QSizePolicy
            ((QSizePolicy *)this,(Policy)((ulong)pQVar3 >> 0x20),(Policy)pQVar3,
             (ControlType)((ulong)this_00 >> 0x20));
  QWidget::setSizePolicy((QWidget *)this,(QSizePolicy)policy);
  updateTopLevelWidget(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QSizeGripPrivate::init()
{
    Q_Q(QSizeGrip);
    m_corner = q->isLeftToRight() ? Qt::BottomRightCorner : Qt::BottomLeftCorner;

#if !defined(QT_NO_CURSOR)
    q->setCursor(m_corner == Qt::TopLeftCorner || m_corner == Qt::BottomRightCorner
                 ? Qt::SizeFDiagCursor : Qt::SizeBDiagCursor);
#endif
    q->setSizePolicy(QSizePolicy(QSizePolicy::Minimum, QSizePolicy::Fixed));
    updateTopLevelWidget();
}